

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O3

void d68020_cpscc(void)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  uint in_EDI;
  uint uVar5;
  
  if (((byte)g_cpu_type & 0x1c) != 0) {
    uVar1 = dasm_read_imm_16(in_EDI);
    uVar2 = dasm_read_imm_16(in_EDI);
    uVar5 = g_cpu_ir >> 9;
    pcVar4 = g_cpcc[uVar1 & 0x3f];
    pcVar3 = get_ea_mode_str(g_cpu_ir,0);
    sprintf(g_dasm_str,"%ds%-4s  %s; (extension = $%x) (2-3)",(ulong)(uVar5 & 7),pcVar4,pcVar3,
            (ulong)uVar2);
    return;
  }
  if ((~g_cpu_ir & 0xf000) == 0) {
    pcVar4 = "dc.w    $%04x; opcode 1111";
  }
  else {
    pcVar4 = "dc.w $%04x; ILLEGAL";
  }
  sprintf(g_dasm_str,pcVar4);
  return;
}

Assistant:

static void d68020_cpscc(void)
{
	uint extension1;
	uint extension2;
	LIMIT_CPU_TYPES(M68020_PLUS);
	extension1 = read_imm_16();
	extension2 = read_imm_16();
	sprintf(g_dasm_str, "%ds%-4s  %s; (extension = $%x) (2-3)", (g_cpu_ir>>9)&7, g_cpcc[extension1&0x3f], get_ea_mode_str_8(g_cpu_ir), extension2);
}